

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# simple-flex-estimation-test.cpp
# Opt level: O0

int test(void)

{
  QuaternionBase<Eigen::Quaternion<double,_0>_> *pQVar1;
  Scalar *pSVar2;
  StorageBaseType *pSVar3;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *pCVar4;
  LhsNested o2;
  DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *other;
  TimeIndex TVar5;
  Matrix<double,__1,_1,_0,__1,_1> *pMVar6;
  ostream *poVar7;
  double dVar8;
  Scalar __x;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> PVar9;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  PVar10;
  non_const_type local_13b8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>
  local_13b0;
  MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
  local_13a0 [32];
  non_const_type local_1380;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
  local_1378;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_134b [3];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_1348;
  AngleAxis<double> local_1328;
  Matrix3 local_1308;
  RealScalar local_12c0;
  double angle_1;
  Type local_12a8;
  Matrix<double,3,1,0,3,1> local_1270 [8];
  Vector3 orientationV_1;
  Matrix3 Rh;
  Vector3 gh;
  non_const_type local_11d8;
  Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>
  local_11d0;
  DenseBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>_>
  local_11a3 [3];
  CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_11a0;
  AngleAxis<double> local_1180;
  Matrix3 local_1160;
  RealScalar local_1118;
  double angle;
  Type local_1100;
  Matrix<double,3,1,0,3,1> local_10c8 [8];
  Vector3 orientationV;
  Matrix3 R;
  Vector3 g;
  TimeIndex i_1;
  double error;
  IndexedVectorArray xh;
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  contactPositions;
  undefined1 local_fb8 [8];
  Vector xh0;
  Type local_f98;
  Type local_f60;
  Type local_f28;
  ConstantReturnType local_ef8;
  undefined1 local_ee0 [8];
  Vector Ximu;
  Matrix<double,_3,_1,_0,_3,_1> local_eb8;
  undefined1 local_ea0 [8];
  Vector3 newVelImu;
  LhsNested local_e40;
  RhsNested local_e38;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_e30;
  undefined1 local_e10 [8];
  Vector3 newPosImu;
  Quaternion newqImu;
  Type local_da0;
  Type local_d68;
  Type local_d30;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_cf8;
  Type local_cd0;
  ConstantReturnType local_c98;
  undefined1 local_c80 [8];
  Vector Ui;
  double local_c68;
  double local_c60;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_c58;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_c38;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_c18;
  double local_bf8;
  double local_bf0;
  double local_be8;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_be0;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_bc0;
  undefined1 local_ba0 [8];
  AngleAxis aaCtrl;
  Vector3 local_b60;
  AngleAxis local_b48;
  QuaternionType local_b28;
  Type local_b00;
  Type local_ac8;
  Type local_a90;
  Type local_a58;
  Type local_a20;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_9e8;
  Type local_9c0;
  RotationMatrixType local_988;
  double local_940;
  double local_938;
  double local_930;
  CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> local_928;
  double local_908;
  double id;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  local_8e0;
  Vector3 local_8c0;
  AngleAxis local_8a8;
  QuaternionType local_888;
  long local_860;
  Index i;
  AccelerometerGyrometer imu;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_740;
  undefined1 local_730 [8];
  Vector3 accImu;
  undefined1 local_708 [8];
  Vector3 velImu;
  Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0> local_6a8;
  CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,_double>,_const_Eigen::Product<Eigen::Matrix<double,_3,_3,_0,_3,_3>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_0>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_698;
  undefined1 local_678 [8];
  Vector3 posImu;
  undefined1 local_650 [8];
  Vector3 oImu;
  Quaternion qImu;
  CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_610;
  Matrix<double,3,1,0,3,1> local_600 [8];
  Vector3 accCtrl;
  Matrix<double,3,1,0,3,1> local_5d8 [8];
  Vector3 velCtrl;
  Vector3 posCtrl;
  Matrix<double,3,1,0,3,1> local_598 [8];
  Vector3 oCtrl;
  Matrix<double,3,1,0,3,1> local_570 [8];
  Vector3 odotCtrl;
  Quaternion qCtrl;
  Type local_500;
  Type local_4c8;
  Type local_490;
  Type local_458;
  CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
  local_420;
  Type local_3f8;
  ConstantReturnType local_3c0;
  undefined1 local_3a8 [8];
  Vector Xi;
  AngleAxis aa;
  undefined1 local_330 [8];
  Vector3 acc;
  Vector3 vel;
  Vector3 pos;
  undefined1 local_2d8 [8];
  Vector3 oi;
  undefined1 local_2b0 [8];
  Vector3 odoti;
  Quaternion q;
  Scalar local_270;
  Scalar local_268;
  undefined1 local_260 [8];
  Vector3 contact;
  IndexedVectorArray prediMea;
  IndexedVectorArray ino;
  IndexedVectorArray z;
  IndexedVectorArray u;
  undefined1 local_d8 [8];
  IndexedVectorArray y;
  IndexedVectorArray x;
  uint inputSize;
  uint stateSize;
  double dt;
  Index kmax;
  
  dt = 4.94065645841247e-321;
  _inputSize = 0.005;
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&y.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_d8);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&z.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&ino.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&prediMea.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)(contact.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array + 2));
  local_268 = -1.0;
  local_270 = 0.0;
  q.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.m_data.array[3]
       = 0.0;
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)local_260,&local_268,&local_270,
             q.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
             m_data.array + 3);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::Identity();
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)local_2b0,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)(oi.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)local_2d8,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)(pos.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (vel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (acc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix((Matrix<double,_3,_1,_0,_3,_1> *)local_330);
  Eigen::RotationBase<Eigen::Quaternion<double,_0>,_3>::matrix
            ((RotationMatrixType *)&aa.m_angle,
             (RotationBase<Eigen::Quaternion<double,_0>,_3> *)
             (odoti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  stateObservation::kine::fixedPointRotationToTranslation
            ((Matrix3 *)&aa.m_angle,(Vector3 *)local_2d8,(Vector3 *)local_2b0,(Vector3 *)local_260,
             (Vector3 *)
             (vel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (Vector3 *)
             (acc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),(Vector3 *)local_330);
  Eigen::AngleAxis<double>::AngleAxis<Eigen::Quaternion<double,0>>
            ((AngleAxis<double> *)
             &Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             (odoti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_3c0,0x12,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_3a8,&local_3c0);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_3f8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,0,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_3f8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (vel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  pSVar2 = Eigen::AngleAxis<double>::angle
                     ((AngleAxis<double> *)
                      &Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows);
  pSVar3 = (StorageBaseType *)
           Eigen::AngleAxis<double>::axis
                     ((AngleAxis<double> *)
                      &Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows);
  Eigen::operator*(&local_420,pSVar2,pSVar3);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_458,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,3,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_458,
             (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&local_420);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_490,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,6,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_490,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
             (acc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_4c8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,9,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_4c8,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_2d8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            (&local_500,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,0xc,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_500,
             (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_330);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
            ((Type *)(qCtrl.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                      m_storage.m_data.array + 3),
             (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,0xf,3);
  Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
            ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)
             (qCtrl.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
              m_data.array + 3),(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_2b0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::setValue((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&y.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (Matrix<double,__1,_1,_0,__1,_1> *)local_3a8,0);
  Eigen::QuaternionBase<Eigen::Quaternion<double,_0>_>::Identity();
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (local_570,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)(oCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
                 .array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (local_598,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)(posCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array + 2));
  Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
            ((Matrix<double,_3,_1,_0,_3,_1> *)
             (velCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),(Matrix<double,_3,_1,_0,_3,_1> *)local_260);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (local_5d8,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)(accCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            (local_600,&local_610);
  Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
            ((Quaternion<double,_0> *)
             (oImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (QuaternionBase<Eigen::Quaternion<double,0>> *)
             (odoti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             (odotCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)local_650,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)(posImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array + 2));
  Eigen::RotationBase<Eigen::Quaternion<double,_0>,_3>::matrix
            ((RotationMatrixType *)
             (velImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2),
             (RotationBase<Eigen::Quaternion<double,_0>,_3> *)
             (odoti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  local_6a8 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                        ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                         (velImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 2),
                         (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (velCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                          m_storage.m_data.array + 2));
  Eigen::
  MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
  operator+(&local_698,
            (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
             *)&local_6a8,
            (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
            (vel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array
            + 2));
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
            ((Matrix<double,3,1,0,3,1> *)local_678,&local_698);
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)local_708,
             (CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>
              *)(accImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array + 2));
  Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::Zero();
  Eigen::Matrix<double,3,1,0,3,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>>>
            ((Matrix<double,3,1,0,3,1> *)local_730,&local_740);
  stateObservation::AccelerometerGyrometer::AccelerometerGyrometer
            ((AccelerometerGyrometer *)&i,false,false,false);
  for (local_860 = 1; local_860 < 1000; local_860 = local_860 + 1) {
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
              (&local_8e0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_2d8,
               (double *)&inputSize);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,3,1,0,3,1> *)&local_8c0,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_8e0);
    stateObservation::kine::rotationVectorToAngleAxis(&local_8a8,&local_8c0);
    Eigen::AngleAxis<double>::operator*
              (&local_888,&local_8a8,
               (QuaternionType *)
               (odoti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    pQVar1 = (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             (odoti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2);
    Eigen::Quaternion<double,_0>::operator=((Quaternion<double,_0> *)pQVar1,&local_888);
    Eigen::AngleAxis<double>::operator=
              ((AngleAxis<double> *)
               &Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               pQVar1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&id,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_2b0,(double *)&inputSize)
    ;
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_2d8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&id);
    local_908 = (double)local_860;
    local_930 = sin(local_908 * 0.007);
    local_930 = local_930 * 0.1;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
              (&local_928,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_2b0,&local_930);
    local_938 = sin(local_908 * 0.03);
    local_938 = local_938 * 0.2;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       (&local_928,&local_938);
    local_940 = sin(local_908 * 0.02);
    local_940 = local_940 * 0.25;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar4,&local_940);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_928);
    Eigen::RotationBase<Eigen::Quaternion<double,_0>,_3>::matrix
              (&local_988,
               (RotationBase<Eigen::Quaternion<double,_0>,_3> *)
               (odoti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    stateObservation::kine::fixedPointRotationToTranslation
              (&local_988,(Vector3 *)local_2d8,(Vector3 *)local_2b0,(Vector3 *)local_260,
               (Vector3 *)
               (vel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (Vector3 *)
               (acc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),(Vector3 *)local_330);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_9c0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,0,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_9c0,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (vel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    pSVar2 = Eigen::AngleAxis<double>::angle
                       ((AngleAxis<double> *)
                        &Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                         .m_rows);
    pSVar3 = (StorageBaseType *)
             Eigen::AngleAxis<double>::axis
                       ((AngleAxis<double> *)
                        &Xi.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage
                         .m_rows);
    Eigen::operator*(&local_9e8,pSVar2,pSVar3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_a20,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,3,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_a20,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_9e8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_a58,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,6,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_a58,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (acc.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_a90,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,9,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_a90,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_2d8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_ac8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,0xc,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_ac8,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_330);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_b00,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_3a8,0xf,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_b00,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_2b0);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&y.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_3a8,local_860);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
              ((CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&aaCtrl.m_angle,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_598,
               (double *)&inputSize);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
              ((Matrix<double,3,1,0,3,1> *)&local_b60,
               (EigenBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&aaCtrl.m_angle);
    stateObservation::kine::rotationVectorToAngleAxis(&local_b48,&local_b60);
    Eigen::AngleAxis<double>::operator*
              (&local_b28,&local_b48,
               (QuaternionType *)
               (odotCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    pQVar1 = (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
             (odotCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data
              .array + 2);
    Eigen::Quaternion<double,_0>::operator=((Quaternion<double,_0> *)pQVar1,&local_b28);
    Eigen::AngleAxis<double>::AngleAxis<Eigen::Quaternion<double,0>>
              ((AngleAxis<double> *)local_ba0,pQVar1);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
              (&local_bc0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_570,
               (double *)&inputSize);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_598,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_bc0);
    local_be8 = sin(local_908 * 0.008);
    local_be8 = local_be8 * 0.15;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
              (&local_be0,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_570,&local_be8);
    local_bf0 = sin(local_908 * 0.023);
    local_bf0 = local_bf0 * 0.1;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       (&local_be0,&local_bf0);
    local_bf8 = sin(local_908 * 0.025);
    local_bf8 = local_bf8 * 0.2;
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_(pCVar4,&local_bf8);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_be0);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
              (&local_c18,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_5d8,
               (double *)&inputSize);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)
               (velCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2),
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_c18);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator*
              (&local_c38,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_600,
               (double *)&inputSize);
    Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator+=
              ((MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_5d8,
               (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                *)&local_c38);
    local_c60 = sin(local_908 * 0.018);
    local_c60 = local_c60 * 0.12;
    Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator<<
              (&local_c58,(DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_600,&local_c60);
    local_c68 = sin(local_908 * 0.035);
    local_c68 = local_c68 * 0.08;
    pCVar4 = Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
                       (&local_c58,&local_c68);
    dVar8 = sin(local_908 * 0.027);
    Ui.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows =
         (Index)(dVar8 * 0.3);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::operator_
              (pCVar4,(Scalar *)
                      &Ui.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.
                       m_rows);
    Eigen::CommaInitializer<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::~CommaInitializer(&local_c58);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_c98,0xf,1);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_c80,&local_c98);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_cd0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_c80,0,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_cd0,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (velCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    pSVar2 = Eigen::AngleAxis<double>::angle((AngleAxis<double> *)local_ba0);
    pSVar3 = (StorageBaseType *)Eigen::AngleAxis<double>::axis((AngleAxis<double> *)local_ba0);
    Eigen::operator*(&local_cf8,pSVar2,pSVar3);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_d30,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_c80,3,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_d30,
               (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                *)&local_cf8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_d68,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_c80,6,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_d68,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_5d8);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_da0,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_c80,9,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_da0,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_598);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              ((Type *)(newqImu.m_coeffs.
                        super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.m_storage.
                        m_data.array + 3),
               (DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_c80,0xc,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)
               (newqImu.m_coeffs.super_PlainObjectBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_>.
                m_storage.m_data.array + 3),
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_600);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&z.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_c80,local_860);
    Eigen::QuaternionBase<Eigen::Quaternion<double,0>>::operator*
              ((Quaternion<double,_0> *)
               (newPosImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2),
               (QuaternionBase<Eigen::Quaternion<double,0>> *)
               (odoti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (QuaternionBase<Eigen::Quaternion<double,_0>_> *)
               (odotCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    Eigen::RotationBase<Eigen::Quaternion<double,_0>,_3>::matrix
              ((RotationMatrixType *)
               (newVelImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2),
               (RotationBase<Eigen::Quaternion<double,_0>,_3> *)
               (odoti.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2));
    PVar9 = Eigen::MatrixBase<Eigen::Matrix<double,3,3,0,3,3>>::operator*
                      ((MatrixBase<Eigen::Matrix<double,3,3,0,3,3>> *)
                       (newVelImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array + 2),
                       (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                       (velCtrl.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                        m_storage.m_data.array + 2));
    local_e38 = PVar9.m_rhs;
    o2 = PVar9.m_lhs;
    local_e40 = o2;
    Eigen::
    MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>::
    operator+(&local_e30,
              (MatrixBase<Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>>
               *)&local_e40,
              (MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
              (vel.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
               array + 2));
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::CwiseBinaryOp<Eigen::internal::scalar_sum_op<double,double>,Eigen::Product<Eigen::Matrix<double,3,3,0,3,3>,Eigen::Matrix<double,3,1,0,3,1>,0>const,Eigen::Matrix<double,3,1,0,3,1>const>>
              ((Matrix<double,3,1,0,3,1> *)local_e10,&local_e30);
    stateObservation::tools::derivate<Eigen::Matrix<double,3,1,0,3,1>>
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_ea0,(tools *)local_678,
               (Matrix<double,_3,_1,_0,_3,_1> *)local_e10,(Matrix<double,_3,_1,_0,_3,_1> *)o2,0.005)
    ;
    stateObservation::tools::derivate<Eigen::Matrix<double,3,1,0,3,1>>
              (&local_eb8,(tools *)local_708,(Matrix<double,_3,_1,_0,_3,_1> *)local_ea0,
               (Matrix<double,_3,_1,_0,_3,_1> *)o2,0.005);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_730,&local_eb8);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_708,(Matrix<double,_3,_1,_0,_3,_1> *)local_ea0
              );
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_678,(Matrix<double,_3,_1,_0,_3,_1> *)local_e10
              );
    stateObservation::kine::derivateRotationFD
              ((Vector3 *)
               &Ximu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
               ,(Quaternion *)
                (oImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                 array + 2),
               (Quaternion *)
               (newPosImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2),0.005);
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::operator=
              ((Matrix<double,_3,_1,_0,_3,_1> *)local_650,
               (Matrix<double,_3,_1,_0,_3,_1> *)
               &Ximu.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows
              );
    Eigen::Quaternion<double,_0>::operator=
              ((Quaternion<double,_0> *)
               (oImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                array + 2),
               (Quaternion<double,_0> *)
               (newPosImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero(&local_ef8,10,1);
    Eigen::Matrix<double,-1,1,0,-1,1>::
    Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
              ((Matrix<double,_1,1,0,_1,1> *)local_ee0,&local_ef8);
    other = (DenseBase<Eigen::Matrix<double,_4,_1,_0,_4,_1>_> *)
            Eigen::Quaternion<double,_0>::coeffs
                      ((Quaternion<double,_0> *)
                       (oImu.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array + 2));
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::head<4>
              (&local_f28,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ee0,4);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,4,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,4,1,false> *)&local_f28,other);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_f60,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ee0,4,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_f60,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_730);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_f98,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)local_ee0,7,3);
    Eigen::Block<Eigen::Matrix<double,-1,1,0,-1,1>,-1,1,false>::operator=
              ((Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false> *)&local_f98,
               (DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_650);
    stateObservation::AlgebraicSensor::setState((Matrix *)&i,(long)local_ee0);
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)&ino.v_.
                   super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                   ._M_impl.super__Deque_impl_data._M_finish._M_node,
               (Matrix<double,__1,_1,_0,__1,_1> *)local_ee0,local_860);
    stateObservation::AlgebraicSensor::getMeasurements((bool)((char)&xh0 + '\b'));
    stateObservation::
    IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
    ::setValue((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                *)local_d8,
               (Matrix<double,__1,_1,_0,__1,_1> *)
               &xh0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows,
               local_860);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)
               &xh0.super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.m_storage.m_rows)
    ;
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_ee0);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_c80);
  }
  stateObservation::AccelerometerGyrometer::~AccelerometerGyrometer((AccelerometerGyrometer *)&i);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_3a8);
  Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::Zero
            ((ConstantReturnType *)
             &contactPositions.
              super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              ._M_impl.super__Vector_impl_data._M_end_of_storage,0x12,1);
  Eigen::Matrix<double,-1,1,0,-1,1>::
  Matrix<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,_1,1,0,_1,1>>>
            ((Matrix<double,_1,1,0,_1,1> *)local_fb8,
             (EigenBase<Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&contactPositions.
                 super__Vector_base<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
            *)&xh.v_.
               super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
               ._M_impl.super__Deque_impl_data._M_finish._M_node);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::push_back((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
               *)&xh.v_.
                  super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                  ._M_impl.super__Deque_impl_data._M_finish._M_node,(value_type *)local_260);
  stateObservation::examples::offlineEKFFlexibilityEstimation
            ((IndexedVectorArray *)&error,(IndexedVectorArray *)local_d8,
             (IndexedVectorArray *)
             &z.v_.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,(Vector *)local_fb8,1,
             (vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
              *)&xh.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node,0.005,
             (IndexedVectorArray *)
             &prediMea.v_.
              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              ._M_impl.super__Deque_impl_data._M_finish._M_node,
             (IndexedVectorArray *)
             (contact.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
              array + 2));
  i_1 = 0;
  g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
       (double)stateObservation::
               IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
               ::getFirstIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                                *)local_d8);
  while( true ) {
    TVar5 = stateObservation::
            IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
            ::getNextIndex((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                            *)local_d8);
    if (TVar5 <= (long)g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                       m_data.array[2]) break;
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
              ((Matrix<double,_3,_3,_0,_3,_3> *)
               (orientationV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                m_data.array + 2));
    pMVar6 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&y.v_.
                              super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                              ._M_impl.super__Deque_impl_data._M_finish._M_node,
                          (TimeIndex)
                          g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2]);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&angle,pMVar6)
    ;
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_1100,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&angle,3,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (local_10c8,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_1100);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&angle);
    local_1118 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                           ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_10c8);
    if (local_1118 <= 1e-16) {
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)
                 (orientationV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),local_11a3);
    }
    else {
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                (&local_11a0,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_10c8,&local_1118);
      Eigen::AngleAxis<double>::
      AngleAxis<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_1180,&local_1118,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)&local_11a0);
      Eigen::AngleAxis<double>::toRotationMatrix(&local_1160,&local_1180);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)
                 (orientationV.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),&local_1160);
    }
    local_11d8 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                            (orientationV.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array + 2));
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (&local_11d0,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>> *)&local_11d8,
               (MatrixBase<Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>_>
                *)(gh.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.
                   array + 2));
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8),
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>_>
                *)&local_11d0);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    Eigen::Matrix<double,_3,_1,_0,_3,_1>::Matrix
              ((Matrix<double,_3,_1,_0,_3,_1> *)
               (Rh.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    Eigen::Matrix<double,_3,_3,_0,_3,_3>::Matrix
              ((Matrix<double,_3,_3,_0,_3,_3> *)
               (orientationV_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                m_storage.m_data.array + 2));
    pMVar6 = stateObservation::
             IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
             ::operator[]((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                           *)&error,
                          (TimeIndex)
                          g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                          m_data.array[2]);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::Matrix
              ((Matrix<double,__1,_1,_0,__1,_1> *)&angle_1,pMVar6);
    Eigen::DenseBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>::segment<int>
              (&local_12a8,(DenseBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_> *)&angle_1,3,3);
    Eigen::Matrix<double,3,1,0,3,1>::
    Matrix<Eigen::Block<Eigen::Matrix<double,_1,1,0,_1,1>,_1,1,false>>
              (local_1270,
               (EigenBase<Eigen::Block<Eigen::Matrix<double,__1,_1,_0,__1,_1>,__1,_1,_false>_> *)
               &local_12a8);
    Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)&angle_1);
    local_12c0 = Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::norm
                           ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)local_1270);
    if (local_12c0 <= 1e-16) {
      Eigen::MatrixBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::Identity();
      Eigen::Matrix<double,3,3,0,3,3>::operator=
                ((Matrix<double,3,3,0,3,3> *)
                 (orientationV_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),local_134b);
    }
    else {
      Eigen::MatrixBase<Eigen::Matrix<double,3,1,0,3,1>>::operator/
                (&local_1348,(MatrixBase<Eigen::Matrix<double,3,1,0,3,1>> *)local_1270,&local_12c0);
      Eigen::AngleAxis<double>::
      AngleAxis<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,double>,Eigen::Matrix<double,3,1,0,3,1>const,Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,Eigen::Matrix<double,3,1,0,3,1>const>const>>
                (&local_1328,&local_12c0,
                 (MatrixBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_quotient_op<double,_double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>,_const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_constant_op<double>,_const_Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>_>
                  *)&local_1348);
      Eigen::AngleAxis<double>::toRotationMatrix(&local_1308,&local_1328);
      Eigen::Matrix<double,_3,_3,_0,_3,_3>::operator=
                ((Matrix<double,_3,_3,_0,_3,_3> *)
                 (orientationV_1.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.
                  m_storage.m_data.array + 2),&local_1308);
    }
    local_1380 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_> *)
                            (orientationV_1.
                             super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                             m_data.array + 2));
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::UnitZ();
    Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>>::operator*
              (&local_1378,
               (MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,3,0,3,3>>> *)&local_1380,
               local_13a0);
    Eigen::Matrix<double,3,1,0,3,1>::operator=
              ((Matrix<double,3,1,0,3,1> *)
               (Rh.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8),
               (DenseBase<Eigen::Product<Eigen::Transpose<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_Eigen::Block<const_Eigen::CwiseNullaryOp<Eigen::internal::scalar_identity_op<double>,_Eigen::Matrix<double,_3,_3,_0,_3,_3>_>,_3,_1,_false>,_0>_>
                *)&local_1378);
    Eigen::MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::normalize
              ((MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
               (Rh.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.m_data.
                array + 8));
    local_13b8 = (non_const_type)
                 Eigen::DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>::transpose
                           ((DenseBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                            (R.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.
                             m_storage.m_data.array + 8));
    PVar10 = Eigen::MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>>::operator*
                       ((MatrixBase<Eigen::Transpose<Eigen::Matrix<double,3,1,0,3,1>>> *)&local_13b8
                        ,(MatrixBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_> *)
                         (Rh.super_PlainObjectBase<Eigen::Matrix<double,_3,_3,_0,_3,_3>_>.m_storage.
                          m_data.array + 8));
    local_13b0 = PVar10;
    __x = Eigen::internal::dense_product_base::operator_cast_to_double
                    ((dense_product_base *)&local_13b0);
    dVar8 = acos(__x);
    i_1 = (TimeIndex)((dVar8 * 180.0) / 3.141592653589793);
    g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.m_data.array[2] =
         (double)((long)g.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                        m_data.array[2] + 1);
  }
  poVar7 = std::operator<<((ostream *)&std::cout,"Error ");
  poVar7 = (ostream *)std::ostream::operator<<(poVar7,(double)i_1);
  std::operator<<(poVar7,", test: ");
  if ((double)i_1 <= 2.0) {
    std::operator<<((ostream *)&std::cout,"SUCCEEDED !!!!!!!");
  }
  else {
    std::operator<<((ostream *)&std::cout,"FAILED !!!!!!!");
  }
  kmax._4_4_ = (uint)((double)i_1 > 2.0);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&error);
  std::
  vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
  ::~vector((vector<Eigen::Matrix<double,_3,_1,_0,_3,_1>,_Eigen::aligned_allocator<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>_>
             *)&xh.v_.
                super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                ._M_impl.super__Deque_impl_data._M_finish._M_node);
  Eigen::Matrix<double,_-1,_1,_0,_-1,_1>::~Matrix((Matrix<double,__1,_1,_0,__1,_1> *)local_fb8);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)(contact.super_PlainObjectBase<Eigen::Matrix<double,_3,_1,_0,_3,_1>_>.m_storage.
                 m_data.array + 2));
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&prediMea.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&ino.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&z.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)local_d8);
  stateObservation::
  IndexedMatrixArrayT<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_std::allocator<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>_>_>
  ::~IndexedMatrixArrayT
            ((IndexedMatrixArrayT<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
              *)&y.v_.
                 super__Deque_base<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_std::allocator<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>_>
                 ._M_impl.super__Deque_impl_data._M_finish._M_node);
  return kmax._4_4_;
}

Assistant:

int test()
{
  /// The number of samples
  const Index kmax = 1000;

  /// sampling period
  const double dt = 5e-3;

  /// Sizes of the states for the state, the measurement, and the input vector
  const unsigned stateSize = 18;
  // const unsigned measurementSize=6;
  const unsigned inputSize = 15;

  /// The array containing all the states, the measurements and the inputs
  IndexedVectorArray x;
  IndexedVectorArray y;
  IndexedVectorArray u;
  IndexedVectorArray z;

  IndexedVectorArray ino;
  IndexedVectorArray prediMea;

  /// Contact vector
  Vector3 contact(-1, 0, 0);

  /// Generation
  {
    Quaternion q(Quaternion::Identity());
    Vector3 odoti(Vector3::Zero());
    Vector3 oi(Vector3::Zero());
    Vector3 pos;
    Vector3 vel;
    Vector3 acc;
    kine::fixedPointRotationToTranslation(q.matrix(), oi, odoti, contact, pos, vel, acc);
    AngleAxis aa(q);

    Vector Xi(Vector::Zero(stateSize, 1));
    Xi.segment(indexes::pos, 3) = pos;
    Xi.segment(indexes::ori, 3) = aa.angle() * aa.axis();
    Xi.segment(indexes::linVel, 3) = vel;
    Xi.segment(indexes::angVel, 3) = oi;
    Xi.segment(indexes::linAcc, 3) = acc;
    Xi.segment(indexes::angAcc, 3) = odoti;
    x.setValue(Xi, 0);

    Quaternion qCtrl(Quaternion::Identity());
    Vector3 odotCtrl(Vector3::Zero());
    Vector3 oCtrl(Vector3::Zero());
    Vector3 posCtrl(contact);
    Vector3 velCtrl(Vector3::Zero());
    Vector3 accCtrl(Vector3::Zero());

    Quaternion qImu(q * qCtrl);
    Vector3 oImu(Vector3::Zero());
    Vector3 posImu(q.matrix() * posCtrl + pos);
    Vector3 velImu(Vector3::Zero());
    Vector3 accImu(Vector3::Zero());

    AccelerometerGyrometer imu;

    for(Index i = 1; i < kmax; ++i)
    {
      q = kine::rotationVectorToAngleAxis(oi * dt) * q;
      aa = q;
      oi += odoti * dt;
      double id = double(i);
      odoti << 0.1 * sin(0.007 * id), 0.2 * sin(0.03 * id), 0.25 * sin(0.02 * id);

      kine::fixedPointRotationToTranslation(q.matrix(), oi, odoti, contact, pos, vel, acc);

      Xi.segment(indexes::pos, 3) = pos;
      Xi.segment(indexes::ori, 3) = aa.angle() * aa.axis();
      Xi.segment(indexes::linVel, 3) = vel;
      Xi.segment(indexes::angVel, 3) = oi;
      Xi.segment(indexes::linAcc, 3) = acc;
      Xi.segment(indexes::angAcc, 3) = odoti;

      x.setValue(Xi, i);

      qCtrl = kine::rotationVectorToAngleAxis(oCtrl * dt) * qCtrl;
      AngleAxis aaCtrl(qCtrl);
      oCtrl += odotCtrl * dt;

      odotCtrl << 0.15 * sin(0.008 * id), 0.1 * sin(0.023 * id), 0.2 * sin(0.025 * id);
      posCtrl += velCtrl * dt;
      velCtrl += accCtrl * dt;
      accCtrl << 0.12 * sin(0.018 * id), 0.08 * sin(0.035 * id), 0.3 * sin(0.027 * id);

      Vector Ui(Vector::Zero(inputSize, 1));
      Ui.segment(indexes::pos, 3) = posCtrl;
      Ui.segment(indexes::ori, 3) = aaCtrl.angle() * aaCtrl.axis();
      Ui.segment(indexes::linVel, 3) = velCtrl;
      Ui.segment(indexes::angVel, 3) = oCtrl;
      Ui.segment(indexes::linAcc, 3) = accCtrl;
      u.setValue(Ui, i);

      Quaternion newqImu(q * qCtrl);
      Vector3 newPosImu(q.matrix() * posCtrl + pos);
      Vector3 newVelImu(tools::derivate(posImu, newPosImu, dt));

      accImu = tools::derivate(velImu, newVelImu, dt);
      velImu = newVelImu;
      posImu = newPosImu;

      oImu = kine::derivateRotationFD(qImu, newqImu, dt);
      qImu = newqImu;

      Vector Ximu(Vector::Zero(10, 1));
      Ximu.head<4>() = qImu.coeffs();
      Ximu.segment(4, 3) = accImu;
      Ximu.segment(7, 3) = oImu;

      imu.setState(Ximu, i);
      z.setValue(Ximu, i);
      y.setValue(imu.getMeasurements(), i);
    }
  }

  /// the initalization of an estimation of the initial state
  Vector xh0 = Vector::Zero(stateSize, 1);

  std::vector<Vector3, Eigen::aligned_allocator<Vector3>> contactPositions;

  contactPositions.push_back(contact);

  stateObservation::IndexedVectorArray xh =
      stateObservation::examples::offlineEKFFlexibilityEstimation(y, u, xh0, 1, contactPositions, dt, &ino, &prediMea);

  double error = 0;

  /// the reconstruction of the state
  for(TimeIndex i = y.getFirstIndex(); i < y.getNextIndex(); ++i)
  {
    Vector3 g;
    {
      Matrix3 R;
      Vector3 orientationV = Vector(x[i]).segment(indexes::ori, 3);
      double angle = orientationV.norm();
      if(angle > cst::epsilonAngle)
        R = AngleAxis(angle, orientationV / angle).toRotationMatrix();
      else
        R = Matrix3::Identity();
      g = R.transpose() * Vector3::UnitZ();
      g.normalize();
    }

    Vector3 gh;
    {
      Matrix3 Rh;

      Vector3 orientationV = Vector(xh[i]).segment(indexes::ori, 3);
      double angle = orientationV.norm();
      if(angle > cst::epsilonAngle)
        Rh = AngleAxis(angle, orientationV / angle).toRotationMatrix();
      else
        Rh = Matrix3::Identity();
      gh = Rh.transpose() * Vector3::UnitZ();
      gh.normalize();
    }

    error = acos(double(g.transpose() * gh)) * 180 / M_PI;
  }

  std::cout << "Error " << error << ", test: ";

  if(error > 2.)
  {
    std::cout << "FAILED !!!!!!!";
    return 1;
  }
  else
  {
    std::cout << "SUCCEEDED !!!!!!!";
    return 0;
  }
}